

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fkScanChildren(Parse *pParse,SrcList *pSrc,Table *pTab,Index *pIdx,FKey *pFKey,int *aiCol,
                   int regData,int nIncr)

{
  WhereInfo *pWVar1;
  long in_RCX;
  long in_RDX;
  long in_RDI;
  long *in_R8;
  long in_R9;
  long in_FS_OFFSET;
  ExprList *unaff_retaddr;
  Expr *in_stack_00000008;
  int in_stack_00000010;
  undefined4 in_stack_00000014;
  Parse *in_stack_00000018;
  i16 iCol_1;
  Expr *pAll;
  Expr *pEq_1;
  Expr *pRight_1;
  Expr *pLeft_1;
  Expr *pNe;
  char *zCol;
  i16 iCol;
  Expr *pEq;
  Expr *pRight;
  Expr *pLeft;
  Vdbe *v;
  int iFkIfZero;
  WhereInfo *pWInfo;
  Expr *pWhere;
  int i;
  sqlite3 *db;
  NameContext sNameContext;
  int in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  undefined2 in_stack_fffffffffffffef0;
  i16 in_stack_fffffffffffffef2;
  int in_stack_fffffffffffffef4;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  int in_stack_ffffffffffffff08;
  undefined2 in_stack_ffffffffffffff0c;
  undefined2 in_stack_ffffffffffffff0e;
  i16 iCol_00;
  undefined8 in_stack_ffffffffffffff10;
  int regBase;
  Expr *pEVar2;
  Table *in_stack_ffffffffffffff18;
  Table *pTab_00;
  Parse *in_stack_ffffffffffffff20;
  Parse *pParse_00;
  int local_94;
  int local_7c;
  undefined1 local_40 [48];
  WhereInfo *in_stack_fffffffffffffff0;
  ExprList *pResultSet;
  
  pResultSet = *(ExprList **)(in_FS_OFFSET + 0x28);
  memset(local_40,0xaa,0x38);
  local_94 = 0;
  sqlite3GetVdbe((Parse *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  if (in_stack_00000010 < 0) {
    local_94 = sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffef4,
                                                  CONCAT22(in_stack_fffffffffffffef2,
                                                           in_stack_fffffffffffffef0)),
                                 in_stack_fffffffffffffeec,in_stack_fffffffffffffee8,0);
  }
  local_7c = 0;
  while( true ) {
    iCol_00 = (i16)((ulong)in_stack_ffffffffffffff10 >> 0x10);
    regBase = (int)((ulong)in_stack_ffffffffffffff10 >> 0x20);
    if ((int)in_R8[5] <= local_7c) break;
    if (in_RCX == 0) {
      in_stack_ffffffffffffff08 = -1;
    }
    else {
      in_stack_ffffffffffffff08 = (int)*(short *)(*(long *)(in_RCX + 8) + (long)local_7c * 2);
    }
    exprTableRegister(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,regBase,iCol_00);
    if (in_R9 == 0) {
      in_stack_ffffffffffffff04 = (undefined4)in_R8[8];
    }
    else {
      in_stack_ffffffffffffff04 = *(undefined4 *)(in_R9 + (long)local_7c * 4);
    }
    sqlite3Expr((sqlite3 *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                in_stack_fffffffffffffef4,
                (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    sqlite3PExpr((Parse *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 in_stack_fffffffffffffefc,
                 (Expr *)CONCAT44(in_stack_fffffffffffffef4,
                                  CONCAT22(in_stack_fffffffffffffef2,in_stack_fffffffffffffef0)),
                 (Expr *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    sqlite3ExprAnd((Parse *)CONCAT26(in_stack_ffffffffffffff0e,
                                     CONCAT24(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)),
                   (Expr *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                   (Expr *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    local_7c = local_7c + 1;
  }
  if ((in_RDX == *in_R8) && (0 < in_stack_00000010)) {
    pParse_00 = (Parse *)&DAT_aaaaaaaaaaaaaaaa;
    if ((*(uint *)(in_RDX + 0x30) & 0x80) == 0) {
      exprTableRegister((Parse *)&DAT_aaaaaaaaaaaaaaaa,in_stack_ffffffffffffff18,regBase,iCol_00);
      exprTableColumn((sqlite3 *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                      (Table *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                      in_stack_fffffffffffffef4,in_stack_fffffffffffffef2);
      sqlite3PExpr((Parse *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                   in_stack_fffffffffffffefc,
                   (Expr *)CONCAT44(in_stack_fffffffffffffef4,
                                    CONCAT22(in_stack_fffffffffffffef2,in_stack_fffffffffffffef0)),
                   (Expr *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    }
    else {
      pTab_00 = (Table *)&DAT_aaaaaaaaaaaaaaaa;
      pEVar2 = (Expr *)0x0;
      for (local_7c = 0; local_7c < (int)(uint)*(ushort *)(in_RCX + 0x5e); local_7c = local_7c + 1)
      {
        in_stack_ffffffffffffff0e = *(undefined2 *)(*(long *)(in_RCX + 8) + (long)local_7c * 2);
        exprTableRegister(pParse_00,pTab_00,(int)((ulong)pEVar2 >> 0x20),
                          (i16)((ulong)pEVar2 >> 0x10));
        pParse_00 = (Parse *)sqlite3Expr((sqlite3 *)
                                         CONCAT44(in_stack_fffffffffffffefc,
                                                  in_stack_fffffffffffffef8),
                                         in_stack_fffffffffffffef4,
                                         (char *)CONCAT44(in_stack_fffffffffffffeec,
                                                          in_stack_fffffffffffffee8));
        pTab_00 = (Table *)sqlite3PExpr((Parse *)CONCAT44(in_stack_ffffffffffffff04,
                                                          in_stack_ffffffffffffff00),
                                        in_stack_fffffffffffffefc,
                                        (Expr *)CONCAT44(in_stack_fffffffffffffef4,
                                                         CONCAT22(in_stack_fffffffffffffef2,
                                                                  in_stack_fffffffffffffef0)),
                                        (Expr *)CONCAT44(in_stack_fffffffffffffeec,
                                                         in_stack_fffffffffffffee8));
        pEVar2 = sqlite3ExprAnd((Parse *)CONCAT26(in_stack_ffffffffffffff0e,
                                                  CONCAT24(in_stack_ffffffffffffff0c,
                                                           in_stack_ffffffffffffff08)),
                                (Expr *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00
                                                ),
                                (Expr *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8
                                                ));
      }
      sqlite3PExpr((Parse *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                   in_stack_fffffffffffffefc,
                   (Expr *)CONCAT44(in_stack_fffffffffffffef4,
                                    CONCAT22(in_stack_fffffffffffffef2,in_stack_fffffffffffffef0)),
                   (Expr *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    }
    sqlite3ExprAnd((Parse *)CONCAT26(in_stack_ffffffffffffff0e,
                                     CONCAT24(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)),
                   (Expr *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                   (Expr *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  }
  memset(local_40,0,0x38);
  sqlite3ResolveExprNames
            ((NameContext *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             (Expr *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  if (*(int *)(in_RDI + 0x34) == 0) {
    in_stack_fffffffffffffee8 = 0;
    in_stack_fffffffffffffef0 = 0;
    in_stack_fffffffffffffef2 = 0;
    pWVar1 = sqlite3WhereBegin(in_stack_00000018,
                               (SrcList *)CONCAT44(in_stack_00000014,in_stack_00000010),
                               in_stack_00000008,unaff_retaddr,pResultSet,
                               (Select *)in_stack_fffffffffffffff0,(u16)pEq,(int)pRight);
    sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffef4,
                                       CONCAT22(in_stack_fffffffffffffef2,in_stack_fffffffffffffef0)
                                      ),in_stack_fffffffffffffeec,in_stack_fffffffffffffee8,0);
    if (pWVar1 != (WhereInfo *)0x0) {
      sqlite3WhereEnd(in_stack_fffffffffffffff0);
    }
  }
  sqlite3ExprDelete((sqlite3 *)
                    CONCAT44(in_stack_fffffffffffffef4,
                             CONCAT22(in_stack_fffffffffffffef2,in_stack_fffffffffffffef0)),
                    (Expr *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  if (local_94 != 0) {
    sqlite3VdbeJumpHereOrPopInst
              ((Vdbe *)CONCAT44(in_stack_fffffffffffffef4,
                                CONCAT22(in_stack_fffffffffffffef2,in_stack_fffffffffffffef0)),
               in_stack_fffffffffffffeec);
  }
  if (*(ExprList **)(in_FS_OFFSET + 0x28) != pResultSet) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void fkScanChildren(
  Parse *pParse,                  /* Parse context */
  SrcList *pSrc,                  /* The child table to be scanned */
  Table *pTab,                    /* The parent table */
  Index *pIdx,                    /* Index on parent covering the foreign key */
  FKey *pFKey,                    /* The foreign key linking pSrc to pTab */
  int *aiCol,                     /* Map from pIdx cols to child table cols */
  int regData,                    /* Parent row data starts here */
  int nIncr                       /* Amount to increment deferred counter by */
){
  sqlite3 *db = pParse->db;       /* Database handle */
  int i;                          /* Iterator variable */
  Expr *pWhere = 0;               /* WHERE clause to scan with */
  NameContext sNameContext;       /* Context used to resolve WHERE clause */
  WhereInfo *pWInfo;              /* Context used by sqlite3WhereXXX() */
  int iFkIfZero = 0;              /* Address of OP_FkIfZero */
  Vdbe *v = sqlite3GetVdbe(pParse);

  assert( pIdx==0 || pIdx->pTable==pTab );
  assert( pIdx==0 || pIdx->nKeyCol==pFKey->nCol );
  assert( pIdx!=0 || pFKey->nCol==1 );
  assert( pIdx!=0 || HasRowid(pTab) );

  if( nIncr<0 ){
    iFkIfZero = sqlite3VdbeAddOp2(v, OP_FkIfZero, pFKey->isDeferred, 0);
    VdbeCoverage(v);
  }

  /* Create an Expr object representing an SQL expression like:
  **
  **   <parent-key1> = <child-key1> AND <parent-key2> = <child-key2> ...
  **
  ** The collation sequence used for the comparison should be that of
  ** the parent key columns. The affinity of the parent key column should
  ** be applied to each child key value before the comparison takes place.
  */
  for(i=0; i<pFKey->nCol; i++){
    Expr *pLeft;                  /* Value from parent table row */
    Expr *pRight;                 /* Column ref to child table */
    Expr *pEq;                    /* Expression (pLeft = pRight) */
    i16 iCol;                     /* Index of column in child table */
    const char *zCol;             /* Name of column in child table */

    iCol = pIdx ? pIdx->aiColumn[i] : -1;
    pLeft = exprTableRegister(pParse, pTab, regData, iCol);
    iCol = aiCol ? aiCol[i] : pFKey->aCol[0].iFrom;
    assert( iCol>=0 );
    zCol = pFKey->pFrom->aCol[iCol].zCnName;
    pRight = sqlite3Expr(db, TK_ID, zCol);
    pEq = sqlite3PExpr(pParse, TK_EQ, pLeft, pRight);
    pWhere = sqlite3ExprAnd(pParse, pWhere, pEq);
  }

  /* If the child table is the same as the parent table, then add terms
  ** to the WHERE clause that prevent this entry from being scanned.
  ** The added WHERE clause terms are like this:
  **
  **     $current_rowid!=rowid
  **     NOT( $current_a==a AND $current_b==b AND ... )
  **
  ** The first form is used for rowid tables.  The second form is used
  ** for WITHOUT ROWID tables. In the second form, the *parent* key is
  ** (a,b,...). Either the parent or primary key could be used to
  ** uniquely identify the current row, but the parent key is more convenient
  ** as the required values have already been loaded into registers
  ** by the caller.
  */
  if( pTab==pFKey->pFrom && nIncr>0 ){
    Expr *pNe;                    /* Expression (pLeft != pRight) */
    Expr *pLeft;                  /* Value from parent table row */
    Expr *pRight;                 /* Column ref to child table */
    if( HasRowid(pTab) ){
      pLeft = exprTableRegister(pParse, pTab, regData, -1);
      pRight = exprTableColumn(db, pTab, pSrc->a[0].iCursor, -1);
      pNe = sqlite3PExpr(pParse, TK_NE, pLeft, pRight);
    }else{
      Expr *pEq, *pAll = 0;
      assert( pIdx!=0 );
      for(i=0; i<pIdx->nKeyCol; i++){
        i16 iCol = pIdx->aiColumn[i];
        assert( iCol>=0 );
        pLeft = exprTableRegister(pParse, pTab, regData, iCol);
        pRight = sqlite3Expr(db, TK_ID, pTab->aCol[iCol].zCnName);
        pEq = sqlite3PExpr(pParse, TK_IS, pLeft, pRight);
        pAll = sqlite3ExprAnd(pParse, pAll, pEq);
      }
      pNe = sqlite3PExpr(pParse, TK_NOT, pAll, 0);
    }
    pWhere = sqlite3ExprAnd(pParse, pWhere, pNe);
  }

  /* Resolve the references in the WHERE clause. */
  memset(&sNameContext, 0, sizeof(NameContext));
  sNameContext.pSrcList = pSrc;
  sNameContext.pParse = pParse;
  sqlite3ResolveExprNames(&sNameContext, pWhere);

  /* Create VDBE to loop through the entries in pSrc that match the WHERE
  ** clause. For each row found, increment either the deferred or immediate
  ** foreign key constraint counter. */
  if( pParse->nErr==0 ){
    pWInfo = sqlite3WhereBegin(pParse, pSrc, pWhere, 0, 0, 0, 0, 0);
    sqlite3VdbeAddOp2(v, OP_FkCounter, pFKey->isDeferred, nIncr);
    if( pWInfo ){
      sqlite3WhereEnd(pWInfo);
    }
  }

  /* Clean up the WHERE clause constructed above. */
  sqlite3ExprDelete(db, pWhere);
  if( iFkIfZero ){
    sqlite3VdbeJumpHereOrPopInst(v, iFkIfZero);
  }
}